

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O3

bool bssl::ssl_set_cert(CERT *cert,UniquePtr<CRYPTO_BUFFER> *buffer)

{
  ssl_credential_st *this;
  bool bVar1;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_18;
  
  this = (cert->legacy_credential)._M_t.
         super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
  local_18._M_head_impl =
       (buffer->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
  (buffer->_M_t).super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl = (crypto_buffer_st *)0x0;
  bVar1 = ssl_credential_st::SetLeafCert(this,(UniquePtr<CRYPTO_BUFFER> *)&local_18,true);
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_18);
  if (bVar1) {
    (*cert->x509_method->cert_flush_cached_leaf)(cert);
  }
  return bVar1;
}

Assistant:

bool ssl_set_cert(CERT *cert, UniquePtr<CRYPTO_BUFFER> buffer) {
  // Don't fail for a cert/key mismatch, just free the current private key.
  // (When switching to a different keypair, the caller should switch the
  // certificate, then the key.)
  if (!cert->legacy_credential->SetLeafCert(std::move(buffer),
                                            /*discard_key_on_mismatch=*/true)) {
    return false;
  }

  cert->x509_method->cert_flush_cached_leaf(cert);
  return true;
}